

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_skip_lseek(archive *a,void *client_data,int64_t request)

{
  __off_t _Var1;
  __off_t _Var2;
  int *piVar3;
  off_t new_offset;
  off_t old_offset;
  read_file_data *mine;
  int64_t request_local;
  void *client_data_local;
  archive *a_local;
  
  _Var1 = lseek(*client_data,0,1);
  if ((_Var1 < 0) || (_Var2 = lseek(*client_data,request,1), _Var2 < 0)) {
    *(undefined1 *)((long)client_data + 0x1c) = 0;
    piVar3 = __errno_location();
    if (*piVar3 == 0x1d) {
      a_local = (archive *)0x0;
    }
    else {
      if (*(int *)((long)client_data + 0x20) == 0) {
        piVar3 = __errno_location();
        archive_set_error(a,*piVar3,"Error seeking in stdin");
      }
      else if (*(int *)((long)client_data + 0x20) == 1) {
        piVar3 = __errno_location();
        archive_set_error(a,*piVar3,"Error seeking in \'%s\'",(long)client_data + 0x24);
      }
      else {
        piVar3 = __errno_location();
        archive_set_error(a,*piVar3,"Error seeking in \'%S\'",(long)client_data + 0x24);
      }
      a_local = (archive *)0xffffffffffffffff;
    }
  }
  else {
    a_local = (archive *)(_Var2 - _Var1);
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_skip_lseek(struct archive *a, void *client_data, int64_t request)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;
#if defined(_WIN32) && !defined(__CYGWIN__)
	/* We use _lseeki64() on Windows. */
	int64_t old_offset, new_offset;
#else
	off_t old_offset, new_offset;
#endif

	/* We use off_t here because lseek() is declared that way. */

	/* TODO: Deal with case where off_t isn't 64 bits.
	 * This shouldn't be a problem on Linux or other POSIX
	 * systems, since the configuration logic for libarchive
	 * tries to obtain a 64-bit off_t.
	 */
	if ((old_offset = lseek(mine->fd, 0, SEEK_CUR)) >= 0 &&
	    (new_offset = lseek(mine->fd, request, SEEK_CUR)) >= 0)
		return (new_offset - old_offset);

	/* If lseek() fails, don't bother trying again. */
	mine->use_lseek = 0;

	/* Let libarchive recover with read+discard */
	if (errno == ESPIPE)
		return (0);

	/* If the input is corrupted or truncated, fail. */
	if (mine->filename_type == FNT_STDIN)
		archive_set_error(a, errno, "Error seeking in stdin");
	else if (mine->filename_type == FNT_MBS)
		archive_set_error(a, errno, "Error seeking in '%s'",
		    mine->filename.m);
	else
		archive_set_error(a, errno, "Error seeking in '%S'",
		    mine->filename.w);
	return (-1);
}